

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall tcu::lookupBorder(tcu *this,TextureFormat *format,Sampler *sampler)

{
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar1;
  Vec4 VVar2;
  bool local_49;
  tcu local_48 [16];
  tcu local_38 [16];
  undefined1 local_28;
  undefined1 local_27;
  bool local_26;
  undefined1 local_25;
  TextureChannelClass local_24;
  bool isPureUnsignedInteger;
  bool isPureInteger;
  bool isFixed;
  bool isFloat;
  TextureChannelClass channelClass;
  Sampler *sampler_local;
  TextureFormat *format_local;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  
  _isPureUnsignedInteger = sampler;
  sampler_local = (Sampler *)format;
  format_local = (TextureFormat *)this;
  local_24 = getTextureChannelClass(format->type);
  local_25 = local_24 == TEXTURECHANNELCLASS_FLOATING_POINT;
  local_49 = local_24 < TEXTURECHANNELCLASS_SIGNED_INTEGER;
  local_26 = local_49;
  local_27 = local_24 == TEXTURECHANNELCLASS_SIGNED_INTEGER;
  local_28 = local_24 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
  if (((bool)local_25) || (local_24 < TEXTURECHANNELCLASS_SIGNED_INTEGER)) {
    VVar1 = sampleTextureBorder<float>(this,(TextureFormat *)sampler_local,_isPureUnsignedInteger);
  }
  else if ((bool)local_27) {
    sampleTextureBorder<int>(local_38,(TextureFormat *)sampler_local,_isPureUnsignedInteger);
    VVar1 = Vector<int,_4>::cast<float>((Vector<int,_4> *)this);
  }
  else if ((bool)local_28) {
    sampleTextureBorder<unsigned_int>
              (local_48,(TextureFormat *)sampler_local,_isPureUnsignedInteger);
    VVar1 = Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
  }
  else {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,-1.0);
    VVar1.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar1.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar1.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar1.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar2.m_data[0] = VVar1.m_data[0];
  auVar3._4_4_ = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  register0x00001244 = VVar1.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

static inline Vec4 lookupBorder (const tcu::TextureFormat& format, const tcu::Sampler& sampler)
{
	// "lookup" for a combined format does not make sense, disallow
	DE_ASSERT(!isCombinedDepthStencilType(format.type));

	const tcu::TextureChannelClass	channelClass			= tcu::getTextureChannelClass(format.type);
	const bool						isFloat					= channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	const bool						isFixed					= channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT ||
															  channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
	const bool						isPureInteger			= channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER;
	const bool						isPureUnsignedInteger	= channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER;

	if (isFloat || isFixed)
		return sampleTextureBorder<float>(format, sampler);
	else if (isPureInteger)
		return sampleTextureBorder<deInt32>(format, sampler).cast<float>();
	else if (isPureUnsignedInteger)
		return sampleTextureBorder<deUint32>(format, sampler).cast<float>();
	else
	{
		DE_ASSERT(false);
		return Vec4(-1.0);
	}
}